

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::HttpClient::WebSocketResponse> __thiscall
kj::anon_unknown_36::PromiseNetworkAddressHttpClient::openWebSocket
          (PromiseNetworkAddressHttpClient *this,StringPtr url,HttpHeaders *headers)

{
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t> *this_00;
  NetworkAddressHttpClient *pNVar1;
  String *pSVar2;
  HttpHeaders *pHVar3;
  int __flags;
  StringPtr *params;
  void *__child_stack;
  __fn *in_R8;
  __fn *__arg;
  StringPtr url_00;
  char *local_160;
  String local_158;
  HttpHeaders local_140;
  undefined1 local_e0 [32];
  HttpHeaders headersCopy;
  String urlCopy;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t> *c;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t> *_c6235;
  HttpHeaders *headers_local;
  PromiseNetworkAddressHttpClient *this_local;
  StringPtr url_local;
  
  this_local = (PromiseNetworkAddressHttpClient *)url.content.size_;
  __arg = in_R8;
  url_local.content.ptr = (char *)headers;
  url_local.content.size_ = (size_t)this;
  this_00 = kj::_::readMaybe<kj::(anonymous_namespace)::NetworkAddressHttpClient,decltype(nullptr)>
                      ((Maybe<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t>_>
                        *)(url.content.ptr + 0x18));
  __flags = (int)headers;
  if (this_00 == (Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t> *)0x0) {
    str<kj::StringPtr&>((String *)&headersCopy.ownedStrings.builder.disposer,(kj *)&this_local,
                        params);
    HttpHeaders::clone((HttpHeaders *)(local_e0 + 0x18),in_R8,__child_stack,__flags,__arg);
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)local_e0);
    local_160 = url.content.ptr;
    pSVar2 = mv<kj::String>((String *)&headersCopy.ownedStrings.builder.disposer);
    String::String(&local_158,pSVar2);
    pHVar3 = mv<kj::HttpHeaders>((HttpHeaders *)(local_e0 + 0x18));
    HttpHeaders::HttpHeaders(&local_140,pHVar3);
    Promise<void>::
    then<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::openWebSocket(kj::StringPtr,kj::HttpHeaders_const&)::_lambda()_1_>
              ((Promise<void> *)this,(Type *)local_e0);
    kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::
    openWebSocket(kj::StringPtr,kj::HttpHeaders_const&)::{lambda()#1}::~HttpHeaders
              ((_lambda___1_ *)&local_160);
    Promise<void>::~Promise((Promise<void> *)local_e0);
    HttpHeaders::~HttpHeaders((HttpHeaders *)(local_e0 + 0x18));
    String::~String((String *)&headersCopy.ownedStrings.builder.disposer);
  }
  else {
    pNVar1 = Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t>::operator->
                       (this_00);
    url_00.content.size_ = (size_t)this_local;
    url_00.content.ptr = (char *)pNVar1;
    NetworkAddressHttpClient::openWebSocket
              ((NetworkAddressHttpClient *)this,url_00,(HttpHeaders *)url_local.content.ptr);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<WebSocketResponse> openWebSocket(
      kj::StringPtr url, const HttpHeaders& headers) override {
    KJ_IF_SOME(c, client) {
      return c->openWebSocket(url, headers);
    } else {
      auto urlCopy = kj::str(url);
      auto headersCopy = headers.clone();
      return promise.addBranch().then(
          [this,url=kj::mv(urlCopy),headers=kj::mv(headersCopy)]() {
        return KJ_ASSERT_NONNULL(client)->openWebSocket(url, headers);
      });
    }